

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall QPDF::insertPage(QPDF *this,QPDFObjectHandle *newpage,int pos)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QPDF *pQVar4;
  size_t sVar5;
  pointer pMVar6;
  size_type sVar7;
  runtime_error *this_00;
  size_type sVar8;
  pointer pMVar9;
  reference obj;
  int local_224;
  int local_1dc;
  iterator iStack_1d8;
  int i;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_1d0;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_1c8;
  const_iterator local_1c0;
  QPDFObjectHandle local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  int local_180;
  allocator<char> local_179;
  int npages;
  allocator<char> local_151;
  string local_150 [32];
  undefined1 local_130 [8];
  QPDFObjectHandle kids;
  string local_118 [32];
  undefined1 local_f8 [24];
  QPDFObjectHandle pages;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8;
  QPDFObjGen local_a8;
  QPDFObjGen og;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  allocator<char> local_71;
  string local_70;
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  int local_1c;
  QPDFObjectHandle *pQStack_18;
  int pos_local;
  QPDFObjectHandle *newpage_local;
  QPDF *this_local;
  
  local_1c = pos;
  pQStack_18 = newpage;
  newpage_local = (QPDFObjectHandle *)this;
  flattenPagesTree(this);
  bVar2 = QPDFObjectHandle::isIndirect(newpage);
  if (bVar2) {
    pQVar4 = QPDFObjectHandle::getOwningQPDF(newpage);
    if (pQVar4 == this) {
      QTC::TC("qpdf","QPDF insert indirect page",0);
    }
    else {
      QTC::TC("qpdf","QPDF insert foreign page",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
      pQVar4 = QPDFObjectHandle::getQPDF(newpage,&local_70);
      pushInheritedAttributesToPage(pQVar4);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      QPDFObjectHandle::QPDFObjectHandle(&local_98,newpage);
      copyForeignObject((QPDF *)&local_88,(QPDFObjectHandle *)this);
      QPDFObjectHandle::operator=(newpage,&local_88);
      QPDFObjectHandle::~QPDFObjectHandle(&local_88);
      QPDFObjectHandle::~QPDFObjectHandle(&local_98);
    }
  }
  else {
    QTC::TC("qpdf","QPDF insert non-indirect page",0);
    QPDFObjectHandle::QPDFObjectHandle(&local_40,newpage);
    makeIndirectObject((QPDF *)&local_30,(QPDFObjectHandle *)this);
    QPDFObjectHandle::operator=(newpage,&local_30);
    QPDFObjectHandle::~QPDFObjectHandle(&local_30);
    QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  }
  if (-1 < local_1c) {
    sVar5 = toS<int>(&local_1c);
    pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sVar7 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                      (&pMVar6->all_pages);
    iVar1 = local_1c;
    if (sVar5 <= sVar7) {
      if (local_1c == 0) {
        local_224 = 0;
      }
      else {
        pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        og = (QPDFObjGen)
             std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                       (&pMVar6->all_pages);
        iVar3 = toI<unsigned_long>((unsigned_long *)&og);
        local_224 = 2;
        if (iVar1 == iVar3) {
          local_224 = 1;
        }
      }
      QTC::TC("qpdf","QPDF insert page",local_224);
      local_a8 = QPDFObjectHandle::getObjGen(newpage);
      pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      sVar8 = std::
              map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
              ::count(&pMVar6->pageobj_to_pages_pos,&local_a8);
      if (sVar8 != 0) {
        QTC::TC("qpdf","QPDF resolve duplicated page in insert",0);
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &pages.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,newpage);
        QPDFObjectHandle::shallowCopy(&local_c8);
        makeIndirectObject((QPDF *)&local_b8,(QPDFObjectHandle *)this);
        QPDFObjectHandle::operator=(newpage,&local_b8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_c8);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &pages.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      getRoot((QPDF *)local_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_118,"/Pages",
                 (allocator<char> *)
                 ((long)&kids.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_f8 + 0x10),(string *)local_f8);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&kids.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_150,"/Kids",&local_151);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_130,(string *)(local_f8 + 0x10));
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator(&local_151);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&npages,"/Parent",&local_179);
      QPDFObjectHandle::replaceKey(newpage,(string *)&npages,(QPDFObjectHandle *)(local_f8 + 0x10));
      std::__cxx11::string::~string((string *)&npages);
      std::allocator<char>::~allocator(&local_179);
      QPDFObjectHandle::insertItem((QPDFObjectHandle *)local_130,local_1c,newpage);
      local_180 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_130);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"/Count",&local_1a1);
      QPDFObjectHandle::newInteger(&local_1b8,(long)local_180);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)(local_f8 + 0x10),&local_1a0,&local_1b8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pMVar9 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      local_1d0._M_current =
           (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                     (&pMVar9->all_pages);
      local_1c8 = __gnu_cxx::
                  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                  ::operator+(&local_1d0,(long)local_1c);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
      ::__normal_iterator<QPDFObjectHandle*>
                ((__normal_iterator<QPDFObjectHandle_const*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>
                  *)&local_1c0,&local_1c8);
      iStack_1d8 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::insert
                             (&pMVar6->all_pages,local_1c0,newpage);
      local_1dc = local_1c;
      while (local_1dc = local_1dc + 1, local_1dc < local_180) {
        pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        sVar5 = toS<int>(&local_1dc);
        obj = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                        (&pMVar6->all_pages,sVar5);
        insertPageobjToPage(this,obj,local_1dc,false);
      }
      insertPageobjToPage(this,newpage,local_1c,true);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_130);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_f8 + 0x10));
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"QPDF::insertPage called with pos out of range");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::insertPage(QPDFObjectHandle newpage, int pos)
{
    // pos is numbered from 0, so pos = 0 inserts at the beginning and pos = npages adds to the end.

    flattenPagesTree();

    if (!newpage.isIndirect()) {
        QTC::TC("qpdf", "QPDF insert non-indirect page");
        newpage = makeIndirectObject(newpage);
    } else if (newpage.getOwningQPDF() != this) {
        QTC::TC("qpdf", "QPDF insert foreign page");
        newpage.getQPDF().pushInheritedAttributesToPage();
        newpage = copyForeignObject(newpage);
    } else {
        QTC::TC("qpdf", "QPDF insert indirect page");
    }

    if ((pos < 0) || (toS(pos) > m->all_pages.size())) {
        throw std::runtime_error("QPDF::insertPage called with pos out of range");
    }

    QTC::TC(
        "qpdf",
        "QPDF insert page",
        (pos == 0) ? 0 :                            // insert at beginning
            (pos == toI(m->all_pages.size())) ? 1   // at end
                                              : 2); // insert in middle

    auto og = newpage.getObjGen();
    if (m->pageobj_to_pages_pos.count(og)) {
        QTC::TC("qpdf", "QPDF resolve duplicated page in insert");
        newpage = makeIndirectObject(QPDFObjectHandle(newpage).shallowCopy());
    }

    QPDFObjectHandle pages = getRoot().getKey("/Pages");
    QPDFObjectHandle kids = pages.getKey("/Kids");

    newpage.replaceKey("/Parent", pages);
    kids.insertItem(pos, newpage);
    int npages = kids.getArrayNItems();
    pages.replaceKey("/Count", QPDFObjectHandle::newInteger(npages));
    m->all_pages.insert(m->all_pages.begin() + pos, newpage);
    for (int i = pos + 1; i < npages; ++i) {
        insertPageobjToPage(m->all_pages.at(toS(i)), i, false);
    }
    insertPageobjToPage(newpage, pos, true);
}